

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

void __thiscall
Connection_twoEncapsulatedChildComponentsWithConnectionsAndPublicInterfaces_Test::TestBody
          (Connection_twoEncapsulatedChildComponentsWithConnectionsAndPublicInterfaces_Test *this)

{
  element_type *peVar1;
  element_type *peVar2;
  char *pcVar3;
  string a;
  PrinterPtr printer;
  AssertHelper local_b8 [8];
  Message local_b0 [8];
  VariablePtr v1;
  VariablePtr v3;
  VariablePtr v2;
  ComponentPtr parent;
  ComponentPtr child2;
  ComponentPtr child1;
  AssertionResult gtest_ar;
  ModelPtr m;
  string e;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component name=\"parent\">\n    <variable name=\"variable1\" interface=\"public\"/>\n  </component>\n  <component name=\"child1\">\n    <variable name=\"variable2\" interface=\"public\"/>\n  </component>\n  <component name=\"child2\">\n    <variable name=\"variable3\" interface=\"public\"/>\n  </component>\n  <connection component_1=\"parent\" component_2=\"child1\">\n    <map_variables variable_1=\"variable1\" variable_2=\"variable2\"/>\n  </connection>\n  <connection component_1=\"parent\" component_2=\"child2\">\n    <map_variables variable_1=\"variable1\" variable_2=\"variable3\"/>\n  </connection>\n  <encapsulation>\n    <component_ref component=\"parent\">\n      <component_ref component=\"child1\"/>\n      <component_ref component=\"child2\"/>\n    </component_ref>\n  </encapsulation>\n</model>\n"
             ,(allocator<char> *)&a);
  libcellml::Model::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  peVar2 = parent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"parent",(allocator<char> *)&printer);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string((string *)&a);
  peVar2 = child1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"child1",(allocator<char> *)&printer);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string((string *)&a);
  peVar2 = child2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"child2",(allocator<char> *)&printer);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string((string *)&a);
  peVar1 = v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"variable1",(allocator<char> *)&printer);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&a);
  peVar1 = v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"variable2",(allocator<char> *)&printer);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&a);
  peVar1 = v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"variable3",(allocator<char> *)&printer);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&a);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             parent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             parent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable
            ((shared_ptr *)
             parent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable
            ((shared_ptr *)
             child1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable
            ((shared_ptr *)
             child2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Variable::addEquivalence((shared_ptr *)&v1,(shared_ptr *)&v2);
  libcellml::Variable::addEquivalence((shared_ptr *)&v1,(shared_ptr *)&v3);
  libcellml::Variable::setInterfaceType
            ((InterfaceType)
             v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Variable::setInterfaceType
            ((InterfaceType)
             v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Variable::setInterfaceType
            ((InterfaceType)
             v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Printer::create();
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&a,
             (bool)printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ._0_1_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"e","a",&e,&a);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_b0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x4c4,pcVar3);
    testing::internal::AssertHelper::operator=(local_b8,local_b0);
    testing::internal::AssertHelper::~AssertHelper(local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&a);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&child2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&child1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&e);
  return;
}

Assistant:

TEST(Connection, twoEncapsulatedChildComponentsWithConnectionsAndPublicInterfaces)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"parent\">\n"
        "    <variable name=\"variable1\" interface=\"public\"/>\n"
        "  </component>\n"
        "  <component name=\"child1\">\n"
        "    <variable name=\"variable2\" interface=\"public\"/>\n"
        "  </component>\n"
        "  <component name=\"child2\">\n"
        "    <variable name=\"variable3\" interface=\"public\"/>\n"
        "  </component>\n"
        "  <connection component_1=\"parent\" component_2=\"child1\">\n"
        "    <map_variables variable_1=\"variable1\" variable_2=\"variable2\"/>\n"
        "  </connection>\n"
        "  <connection component_1=\"parent\" component_2=\"child2\">\n"
        "    <map_variables variable_1=\"variable1\" variable_2=\"variable3\"/>\n"
        "  </connection>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"parent\">\n"
        "      <component_ref component=\"child1\"/>\n"
        "      <component_ref component=\"child2\"/>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";

    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr parent = libcellml::Component::create();
    libcellml::ComponentPtr child1 = libcellml::Component::create();
    libcellml::ComponentPtr child2 = libcellml::Component::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::VariablePtr v3 = libcellml::Variable::create();

    parent->setName("parent");
    child1->setName("child1");
    child2->setName("child2");
    v1->setName("variable1");
    v2->setName("variable2");
    v3->setName("variable3");

    m->addComponent(parent);
    parent->addComponent(child1);
    parent->addComponent(child2);
    parent->addVariable(v1);
    child1->addVariable(v2);
    child2->addVariable(v3);
    libcellml::Variable::addEquivalence(v1, v2);
    libcellml::Variable::addEquivalence(v1, v3);
    v1->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC);
    v2->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC);
    v3->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(m);
    EXPECT_EQ(e, a);
}